

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

int SSL_set_tlsext_host_name(SSL *ssl,char *name)

{
  size_t sVar1;
  char *__p;
  UniquePtr<char> *this;
  uint uVar2;
  
  this = &ssl->hostname;
  std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)this,(pointer)0x0);
  if (name == (char *)0x0) {
    uVar2 = 1;
  }
  else {
    sVar1 = strlen(name);
    if (sVar1 - 0x100 < 0xffffffffffffff01) {
      uVar2 = 0;
      ERR_put_error(0x10,0,0xd5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0x841);
    }
    else {
      __p = OPENSSL_strdup(name);
      std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)this,__p);
      uVar2 = (uint)((this->_M_t).super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0);
    }
  }
  return uVar2;
}

Assistant:

int SSL_set_tlsext_host_name(SSL *ssl, const char *name) {
  ssl->hostname.reset();
  if (name == nullptr) {
    return 1;
  }

  size_t len = strlen(name);
  if (len == 0 || len > TLSEXT_MAXLEN_host_name) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SSL3_EXT_INVALID_SERVERNAME);
    return 0;
  }
  ssl->hostname.reset(OPENSSL_strdup(name));
  if (ssl->hostname == nullptr) {
    return 0;
  }
  return 1;
}